

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void openjtalk_pause(OpenJTalk *oj)

{
  long in_RDI;
  unsigned_long in_stack_00000008;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else if ((g_psd->stop & 1U) == 0) {
    if (g_verbose) {
      console_message((char *)0x19a3a5);
    }
    g_psd->pause = true;
    do {
      sleep_internal(in_stack_00000008);
    } while ((g_psd->speaking & 1U) != 0);
    g_psd->pause = false;
    if ((g_verbose & 1U) != 0) {
      console_message((char *)0x19a3f3);
    }
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_pause(OpenJTalk *oj)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	if (g_psd->stop)
	{
		return;
	}

	if (g_verbose)
	{
		console_message(u8"[PAUSE処理開始]\n");
	}
	g_psd->pause = true;
	do
	{
		sleep_internal(100);
	} while (g_psd->speaking);
	g_psd->pause = false;
	if (g_verbose)
	{
		console_message(u8"[PAUSE処理終了]\n");
	}
}